

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

void emit_atom(JSParseState *s,JSAtom name)

{
  JSAtomStruct *pJVar1;
  uint8_t local_4 [4];
  
  if (0xd1 < (int)name) {
    pJVar1 = s->ctx->rt->atom_array[name];
    (pJVar1->header).ref_count = (pJVar1->header).ref_count + 1;
  }
  dbuf_put(&s->cur_func->byte_code,local_4,4);
  return;
}

Assistant:

static void emit_atom(JSParseState *s, JSAtom name)
{
    emit_u32(s, JS_DupAtom(s->ctx, name));
}